

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doc_comment.cc
# Opt level: O0

void google::protobuf::compiler::java::WriteServiceDocComment
               (Printer *printer,ServiceDescriptor *service,Options *options)

{
  Options *printer_00;
  ServiceDescriptor *pSVar1;
  char *pcVar2;
  undefined1 in_R8B;
  string_view sVar3;
  java *local_d0;
  char *local_c8;
  string local_c0;
  string_view local_a0 [2];
  Options local_80;
  string_view local_30;
  Options *local_20;
  Options *options_local;
  ServiceDescriptor *service_local;
  Printer *printer_local;
  
  local_20 = options;
  options_local = (Options *)service;
  service_local = (ServiceDescriptor *)printer;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_30,"/**\n");
  protobuf::io::Printer::Print<>(printer,local_30);
  pSVar1 = service_local;
  printer_00 = options_local;
  Options::Options(&local_80,options);
  pcVar2 = (char *)0x0;
  WriteDocCommentBody<google::protobuf::ServiceDescriptor>
            ((java *)pSVar1,(Printer *)printer_00,(ServiceDescriptor *)&local_80,(Options *)0x0,
             (bool)in_R8B);
  Options::~Options(&local_80);
  pSVar1 = service_local;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_a0," * Protobuf service {@code $fullname$}\n */\n");
  sVar3 = ServiceDescriptor::full_name((ServiceDescriptor *)options_local);
  local_d0 = (java *)sVar3._M_len;
  local_c8 = sVar3._M_str;
  sVar3._M_str = pcVar2;
  sVar3._M_len = (size_t)local_c8;
  EscapeJavadoc_abi_cxx11_(&local_c0,local_d0,sVar3);
  protobuf::io::Printer::Print<char[9],std::__cxx11::string>
            ((Printer *)pSVar1,local_a0[0],(char (*) [9])"fullname",&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  return;
}

Assistant:

void WriteServiceDocComment(io::Printer* printer,
                            const ServiceDescriptor* service,
                            const Options options) {
  printer->Print("/**\n");
  WriteDocCommentBody(printer, service, options, /* kdoc */ false);
  printer->Print(
      " * Protobuf service {@code $fullname$}\n"
      " */\n",
      "fullname", EscapeJavadoc(service->full_name()));
}